

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

int match_url_domain(char *url,size_t urll,char *domain)

{
  int iVar1;
  size_t sVar2;
  char *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  size_t domainl;
  bool local_2a;
  bool local_29;
  ulong local_18;
  void *local_10;
  
  sVar2 = strlen(in_RDX);
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_18 == 0) {
      return 0;
    }
    if ((3 < local_18) && (iVar1 = memcmp(local_10,"://",3), iVar1 == 0)) break;
    local_10 = (void *)((long)local_10 + 1);
    local_18 = local_18 - 1;
  }
  local_29 = false;
  if (sVar2 <= local_18 - 3) {
    iVar1 = memicmp((void *)urll,domain,domainl);
    local_29 = false;
    if (iVar1 == 0) {
      local_2a = true;
      if ((local_18 - 3 != sVar2) && (local_2a = true, *(char *)((long)local_10 + sVar2 + 3) != ':')
         ) {
        local_2a = *(char *)((long)local_10 + sVar2 + 3) == '/';
      }
      local_29 = local_2a;
    }
  }
  return (uint)local_29;
}

Assistant:

static int match_url_domain(const char *url, size_t urll, const char *domain)
{
    /* note the length of the domain name we're matching */
    size_t domainl = strlen(domain);

    /* scan to the end of the scheme name */
    for ( ; urll > 0 ; ++url, --urll)
    {
        /* the scheme name ends in "://" */
        if (urll > 3 && memcmp(url, "://", 3) == 0)
        {
            /* skip the :// sequence */
            url += 3;
            urll -= 3;

            /* 
             *   we have a match if the domain name follows, and either it's
             *   the whole rest of the string, or the next character after
             *   the domain name is '/' or ':' 
             */
            return (urll >= domainl
                    && memicmp(url, domain, domainl) == 0
                    && (urll == domainl
                        || url[domainl] == ':'
                        || url[domainl] == '/'));
        }
    }

    /* didn't find the end of the scheme name - fail */
    return FALSE;
}